

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convert.c
# Opt level: O1

void convert_32s1u_C1R(OPJ_INT32 *pSrc,OPJ_BYTE *pDst,OPJ_SIZE_T length)

{
  byte bVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  OPJ_INT32 OVar6;
  OPJ_INT32 OVar7;
  OPJ_INT32 OVar8;
  
  uVar5 = 0;
  if ((length & 0xfffffffffffffff8) != 0) {
    do {
      *pDst = (char)pSrc[uVar5 + 6] * '\x02' |
              (byte)(pSrc[uVar5 + 5] << 2) | (byte)(pSrc[uVar5 + 4] << 3) |
              (byte)(pSrc[uVar5 + 3] << 4) | (byte)(pSrc[uVar5 + 2] << 5) |
              (byte)(pSrc[uVar5 + 1] << 6) | (byte)(pSrc[uVar5] << 7) | (byte)pSrc[uVar5 + 7];
      pDst = pDst + 1;
      uVar5 = uVar5 + 8;
    } while (uVar5 < (length & 0xfffffffffffffff8));
  }
  if ((length & 7) == 0) {
    return;
  }
  bVar1 = 0;
  uVar2 = (uint)(length & 7);
  if (uVar2 == 1) {
    OVar6 = 0;
LAB_001088d5:
    OVar7 = 0;
LAB_001088d8:
    OVar8 = 0;
LAB_001088db:
    iVar3 = 0;
  }
  else {
    OVar6 = pSrc[uVar5 + 1];
    if (uVar2 < 3) goto LAB_001088d5;
    OVar7 = pSrc[uVar5 + 2];
    if (uVar2 == 3) goto LAB_001088d8;
    OVar8 = pSrc[uVar5 + 3];
    if (uVar2 < 5) goto LAB_001088db;
    iVar3 = pSrc[uVar5 + 4];
    if (uVar2 != 5) {
      iVar4 = pSrc[uVar5 + 5];
      if (uVar2 == 7) {
        bVar1 = (char)pSrc[uVar5 + 6] * '\x02';
      }
      goto LAB_001088df;
    }
  }
  iVar4 = 0;
LAB_001088df:
  *pDst = (byte)(iVar4 << 2) |
          (byte)(iVar3 << 3) | (byte)(OVar8 << 4) | (byte)(OVar7 << 5) | (byte)(OVar6 << 6) | bVar1
          | (byte)(pSrc[uVar5] << 7);
  return;
}

Assistant:

static void convert_32s1u_C1R(const OPJ_INT32* pSrc, OPJ_BYTE* pDst,
                              OPJ_SIZE_T length)
{
    OPJ_SIZE_T i;
    for (i = 0; i < (length & ~(OPJ_SIZE_T)7U); i += 8U) {
        OPJ_UINT32 src0 = (OPJ_UINT32)pSrc[i + 0];
        OPJ_UINT32 src1 = (OPJ_UINT32)pSrc[i + 1];
        OPJ_UINT32 src2 = (OPJ_UINT32)pSrc[i + 2];
        OPJ_UINT32 src3 = (OPJ_UINT32)pSrc[i + 3];
        OPJ_UINT32 src4 = (OPJ_UINT32)pSrc[i + 4];
        OPJ_UINT32 src5 = (OPJ_UINT32)pSrc[i + 5];
        OPJ_UINT32 src6 = (OPJ_UINT32)pSrc[i + 6];
        OPJ_UINT32 src7 = (OPJ_UINT32)pSrc[i + 7];

        *pDst++ = (OPJ_BYTE)((src0 << 7) | (src1 << 6) | (src2 << 5) | (src3 << 4) |
                             (src4 << 3) | (src5 << 2) | (src6 << 1) | src7);
    }

    if (length & 7U) {
        OPJ_UINT32 src0 = (OPJ_UINT32)pSrc[i + 0];
        OPJ_UINT32 src1 = 0U;
        OPJ_UINT32 src2 = 0U;
        OPJ_UINT32 src3 = 0U;
        OPJ_UINT32 src4 = 0U;
        OPJ_UINT32 src5 = 0U;
        OPJ_UINT32 src6 = 0U;
        length = length & 7U;

        if (length > 1U) {
            src1 = (OPJ_UINT32)pSrc[i + 1];
            if (length > 2U) {
                src2 = (OPJ_UINT32)pSrc[i + 2];
                if (length > 3U) {
                    src3 = (OPJ_UINT32)pSrc[i + 3];
                    if (length > 4U) {
                        src4 = (OPJ_UINT32)pSrc[i + 4];
                        if (length > 5U) {
                            src5 = (OPJ_UINT32)pSrc[i + 5];
                            if (length > 6U) {
                                src6 = (OPJ_UINT32)pSrc[i + 6];
                            }
                        }
                    }
                }
            }
        }
        *pDst++ = (OPJ_BYTE)((src0 << 7) | (src1 << 6) | (src2 << 5) | (src3 << 4) |
                             (src4 << 3) | (src5 << 2) | (src6 << 1));
    }
}